

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

difference_type
utf8::internal::sequence_length<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           lead_it)

{
  byte bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_18;
  uint8_t lead;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lead_it_local;
  
  _Stack_18._M_current = lead_it._M_current;
  pcVar2 = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&stack0xffffffffffffffe8);
  bVar1 = mask8<char>(*pcVar2);
  if (bVar1 < 0x80) {
    lead_it_local._M_current = (char *)0x1;
  }
  else if ((int)(uint)bVar1 >> 5 == 6) {
    lead_it_local._M_current = (char *)0x2;
  }
  else if ((int)(uint)bVar1 >> 4 == 0xe) {
    lead_it_local._M_current = (char *)0x3;
  }
  else if ((int)(uint)bVar1 >> 3 == 0x1e) {
    lead_it_local._M_current = (char *)0x4;
  }
  else {
    lead_it_local._M_current = (char *)0x0;
  }
  return (difference_type)lead_it_local._M_current;
}

Assistant:

inline typename std::iterator_traits<octet_iterator>::difference_type
    sequence_length(octet_iterator lead_it)
    {
        uint8_t lead = utf8::internal::mask8(*lead_it);
        if (lead < 0x80)
            return 1;
        else if ((lead >> 5) == 0x6)
            return 2;
        else if ((lead >> 4) == 0xe)
            return 3;
        else if ((lead >> 3) == 0x1e)
            return 4;
        else
            return 0;
    }